

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O2

void uv::AfterRecv(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  void *pvVar1;
  FILE *__stream;
  CStringStream *pCVar2;
  ILog4zManager *pIVar3;
  char *pcVar4;
  int iVar5;
  _func_int **pp_Var6;
  long *in_FS_OFFSET;
  CStringStream ss;
  string local_48;
  
  __stream = _stdout;
  pvVar1 = handle->data;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("theclass",
                  "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/tcpserver.cpp"
                  ,0x246,"void uv::AfterRecv(uv_stream_t *, ssize_t, const uv_buf_t *)");
  }
  iVar5 = (int)nread;
  if (-1 < nread) {
    if (nread == 0) {
      return;
    }
    PacketSync::recvdata(*(PacketSync **)((long)pvVar1 + 0xf8),(uchar *)buf->base,iVar5);
    return;
  }
  if (nread == -0x68) {
    fprintf(_stdout,"client(%d)conn reset\n",(ulong)*(uint *)((long)pvVar1 + 0x110));
    ss.m_pEnd = (char *)*in_FS_OFFSET;
    pcVar4 = ss.m_pEnd + -0x800;
    ss.m_pBegin = pcVar4;
    ss.m_pCur = pcVar4;
    pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss,"client(");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2,*(int *)((long)pvVar1 + 0x110));
    zsummer::log4z::CStringStream::operator<<(pCVar2,")conn reset");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
    iVar5 = 0x24d;
  }
  else {
    if (nread != -0xfff) {
      GetUVError_abi_cxx11_((string *)&ss,iVar5);
      fprintf(__stream,"%s\n",ss.m_pBegin);
      std::__cxx11::string::~string((string *)&ss);
      ss.m_pEnd = (char *)*in_FS_OFFSET;
      pcVar4 = ss.m_pEnd + -0x800;
      ss.m_pBegin = pcVar4;
      ss.m_pCur = pcVar4;
      pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss,"client(");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2,*(int *)((long)pvVar1 + 0x110));
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2,anon_var_dwarf_d06a);
      GetUVError_abi_cxx11_(&local_48,iVar5);
      zsummer::log4z::CStringStream::operator<<(pCVar2,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar2,0x250);
      pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
      pp_Var6 = pIVar3->_vptr_ILog4zManager;
      goto LAB_00117fe5;
    }
    fprintf(_stdout,"client(%d)eof\n",(ulong)*(uint *)((long)pvVar1 + 0x110));
    ss.m_pEnd = (char *)*in_FS_OFFSET;
    pcVar4 = ss.m_pEnd + -0x800;
    ss.m_pBegin = pcVar4;
    ss.m_pCur = pcVar4;
    pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss,"client(");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2,*(int *)((long)pvVar1 + 0x110));
    zsummer::log4z::CStringStream::operator<<(pCVar2,")eof");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
    iVar5 = 0x24a;
  }
  zsummer::log4z::CStringStream::operator<<(pCVar2,iVar5);
  pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
  pp_Var6 = pIVar3->_vptr_ILog4zManager;
LAB_00117fe5:
  (*pp_Var6[8])(pIVar3,0,2,pcVar4);
  AcceptClient::Close(*(AcceptClient **)((long)pvVar1 + 0x120));
  return;
}

Assistant:

void AfterRecv(uv_stream_t* handle, ssize_t nread, const uv_buf_t* buf)
{
    TcpClientCtx* theclass = (TcpClientCtx*)handle->data;
    assert(theclass);
    if (nread < 0) {/* Error or EOF */
        if (nread == UV_EOF) {
            fprintf(stdout, "client(%d)eof\n", theclass->clientid);
            LOGW("client(" << theclass->clientid << ")eof");
        } else if (nread == UV_ECONNRESET) {
            fprintf(stdout, "client(%d)conn reset\n", theclass->clientid);
            LOGW("client(" << theclass->clientid << ")conn reset");
        } else {
            fprintf(stdout, "%s\n", GetUVError(nread).c_str());
            LOGW("client(" << theclass->clientid << ")：" << GetUVError(nread));
        }
        AcceptClient* acceptclient = (AcceptClient*)theclass->parent_acceptclient;
        acceptclient->Close();
        return;
    } else if (0 == nread)  {/* Everything OK, but nothing read. */

    } else {
        theclass->packet_->recvdata((const unsigned char*)buf->base, nread);
    }
}